

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O3

void __thiscall
ymfm::opl_registers_base<4>::operator_map(opl_registers_base<4> *this,operator_mapping *dest)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  bool bVar4;
  
  bVar1 = this->m_regdata[0x104];
  uVar2 = 0x9060300;
  if ((bVar1 & 1) == 0) {
    uVar2 = 0xffff0300;
  }
  uVar3 = 0xa070401;
  if ((bVar1 & 2) == 0) {
    uVar3 = 0xffff0401;
  }
  dest->chan[0] = uVar2;
  dest->chan[1] = uVar3;
  uVar2 = 0xb080502;
  if ((bVar1 & 4) == 0) {
    uVar2 = 0xffff0502;
  }
  dest->chan[2] = uVar2;
  dest->chan[3] = -(bVar1 & 1) | 0xffff0906;
  dest->chan[4] = -(uint)((bVar1 >> 1 & 1) != 0) | 0xffff0a07;
  dest->chan[5] = -(uint)((bVar1 >> 2 & 1) != 0) | 0xffff0b08;
  dest->chan[6] = 0xffff0f0c;
  dest->chan[7] = 0xffff100d;
  dest->chan[8] = 0xffff110e;
  uVar2 = 0x1b181512;
  if ((bVar1 & 8) == 0) {
    uVar2 = 0xffff1512;
  }
  dest->chan[9] = uVar2;
  uVar2 = 0x1c191613;
  if ((bVar1 & 0x10) == 0) {
    uVar2 = 0xffff1613;
  }
  dest->chan[10] = uVar2;
  bVar4 = (bVar1 & 0x3f) < 0x20;
  uVar2 = 0x1d1a1714;
  if (bVar4) {
    uVar2 = 0xffff1714;
  }
  dest->chan[0xb] = uVar2;
  dest->chan[0xc] = -(uint)((bVar1 >> 3 & 1) != 0) | 0xffff1b18;
  dest->chan[0xd] = -(uint)((bVar1 >> 4 & 1) != 0) | 0xffff1c19;
  dest->chan[0xe] = bVar4 - 1 | 0xffff1d1a;
  dest->chan[0xf] = 0xffff211e;
  dest->chan[0x10] = 0xffff221f;
  dest->chan[0x11] = 0xffff2320;
  return;
}

Assistant:

void opl_registers_base<Revision>::operator_map(operator_mapping &dest) const
{
	if (Revision <= 2)
	{
		// OPL/OPL2 has a fixed map, all 2 operators
		static const operator_mapping s_fixed_map =
		{ {
			operator_list(  0,  3 ),  // Channel 0 operators
			operator_list(  1,  4 ),  // Channel 1 operators
			operator_list(  2,  5 ),  // Channel 2 operators
			operator_list(  6,  9 ),  // Channel 3 operators
			operator_list(  7, 10 ),  // Channel 4 operators
			operator_list(  8, 11 ),  // Channel 5 operators
			operator_list( 12, 15 ),  // Channel 6 operators
			operator_list( 13, 16 ),  // Channel 7 operators
			operator_list( 14, 17 ),  // Channel 8 operators
		} };
		dest = s_fixed_map;
	}
	else
	{
		// OPL3/OPL4 can be configured for 2 or 4 operators
		uint32_t fourop = fourop_enable();

		dest.chan[ 0] = bitfield(fourop, 0) ? operator_list(  0,  3,  6,  9 ) : operator_list(  0,  3 );
		dest.chan[ 1] = bitfield(fourop, 1) ? operator_list(  1,  4,  7, 10 ) : operator_list(  1,  4 );
		dest.chan[ 2] = bitfield(fourop, 2) ? operator_list(  2,  5,  8, 11 ) : operator_list(  2,  5 );
		dest.chan[ 3] = bitfield(fourop, 0) ? operator_list() : operator_list(  6,  9 );
		dest.chan[ 4] = bitfield(fourop, 1) ? operator_list() : operator_list(  7, 10 );
		dest.chan[ 5] = bitfield(fourop, 2) ? operator_list() : operator_list(  8, 11 );
		dest.chan[ 6] = operator_list( 12, 15 );
		dest.chan[ 7] = operator_list( 13, 16 );
		dest.chan[ 8] = operator_list( 14, 17 );

		dest.chan[ 9] = bitfield(fourop, 3) ? operator_list( 18, 21, 24, 27 ) : operator_list( 18, 21 );
		dest.chan[10] = bitfield(fourop, 4) ? operator_list( 19, 22, 25, 28 ) : operator_list( 19, 22 );
		dest.chan[11] = bitfield(fourop, 5) ? operator_list( 20, 23, 26, 29 ) : operator_list( 20, 23 );
		dest.chan[12] = bitfield(fourop, 3) ? operator_list() : operator_list( 24, 27 );
		dest.chan[13] = bitfield(fourop, 4) ? operator_list() : operator_list( 25, 28 );
		dest.chan[14] = bitfield(fourop, 5) ? operator_list() : operator_list( 26, 29 );
		dest.chan[15] = operator_list( 30, 33 );
		dest.chan[16] = operator_list( 31, 34 );
		dest.chan[17] = operator_list( 32, 35 );
	}
}